

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O2

int f(sunrealtype t,N_Vector c,N_Vector cdot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  WebData paVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  WebData paVar17;
  int iVar18;
  int iVar19;
  sunrealtype sVar20;
  sunrealtype in_XMM2_Qa;
  WebData wdata;
  
  lVar7 = N_VGetArrayPointer();
  lVar8 = N_VGetArrayPointer(cdot);
  uVar4 = *(uint *)((long)user_data + 0x40);
  iVar5 = *(int *)((long)user_data + 0x44);
  dVar1 = *(double *)((long)user_data + 0x310);
  dVar2 = *(double *)((long)user_data + 0x318);
  uVar12 = -uVar4;
  wdata = (WebData)(ulong)uVar12;
  iVar18 = 0;
  paVar17 = (WebData)0x0;
  if (0 < (int)uVar4) {
    paVar17 = (WebData)(ulong)uVar4;
  }
  for (paVar10 = (WebData)0x0; paVar10 != (WebData)0x14; paVar10 = (WebData)((long)paVar10->P + 1))
  {
    iVar13 = iVar5;
    if (paVar10 == (WebData)0x13) {
      iVar13 = -iVar5;
    }
    iVar16 = iVar5;
    if (paVar10 != (WebData)0x0) {
      iVar16 = -iVar5;
    }
    iVar16 = iVar16 + iVar18;
    iVar13 = iVar13 + iVar18;
    wdata = paVar10;
    iVar19 = iVar18;
    for (lVar15 = 0; lVar15 != 0x14; lVar15 = lVar15 + 1) {
      lVar11 = lVar15 * (int)uVar4 + (long)paVar10 * (long)iVar5;
      WebRates((double)(int)lVar15 * dVar1,(double)(int)paVar10 * dVar2,in_XMM2_Qa,
               (sunrealtype *)(lVar7 + lVar11 * 8),
               (sunrealtype *)((long)user_data + lVar11 * 8 + 0x328),(WebData)user_data);
      uVar14 = uVar4;
      if (lVar15 == 0x13) {
        uVar14 = uVar12;
      }
      uVar9 = uVar4;
      if (lVar15 != 0) {
        uVar9 = uVar12;
      }
      for (wdata = (WebData)0x0; paVar17 != wdata; wdata = (WebData)((long)wdata->P + 1)) {
        iVar6 = (int)wdata;
        lVar11 = (long)(iVar19 + iVar6);
        dVar3 = *(double *)(lVar7 + lVar11 * 8);
        in_XMM2_Qa = dVar3 - *(double *)(lVar7 + (long)(int)(uVar9 + iVar19 + iVar6) * 8);
        *(double *)(lVar8 + lVar11 * 8) =
             ((*(double *)(lVar7 + (long)(iVar13 + iVar6) * 8) - dVar3) -
             (dVar3 - *(double *)(lVar7 + (long)(iVar6 + iVar16) * 8))) *
             *(double *)((long)user_data + (long)wdata * 8 + 0x2e0) +
             ((*(double *)(lVar7 + (long)(int)(uVar14 + iVar19 + iVar6) * 8) - dVar3) - in_XMM2_Qa)
             * *(double *)((long)user_data + (long)wdata * 8 + 0x2b0) +
             *(double *)((long)user_data + lVar11 * 8 + 0x328);
      }
      iVar19 = iVar19 + uVar4;
      iVar16 = iVar16 + uVar4;
      iVar13 = iVar13 + uVar4;
    }
    iVar18 = iVar18 + iVar5;
  }
  sVar20 = doubleIntgr(c,(int)user_data,wdata);
  *(sunrealtype *)(lVar8 + 0x4b00) = sVar20;
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector c, N_Vector cdot, void* user_data)
{
  int i, ic, ici, idxl, idxu, idyl, idyu, iyoff, jx, jy, ns, mxns;
  sunrealtype dcxli, dcxui, dcyli, dcyui, x, y, *cox, *coy, *fsave, dx, dy;
  sunrealtype *cdata, *cdotdata;
  WebData wdata;

  wdata    = (WebData)user_data;
  cdata    = N_VGetArrayPointer(c);
  cdotdata = N_VGetArrayPointer(cdot);

  mxns  = wdata->mxns;
  ns    = wdata->ns;
  fsave = wdata->fsave;
  cox   = wdata->cox;
  coy   = wdata->coy;
  mxns  = wdata->mxns;
  dx    = wdata->dx;
  dy    = wdata->dy;

  for (jy = 0; jy < MY; jy++)
  {
    y     = jy * dy;
    iyoff = mxns * jy;
    idyu  = (jy == MY - 1) ? -mxns : mxns;
    idyl  = (jy == 0) ? -mxns : mxns;
    for (jx = 0; jx < MX; jx++)
    {
      x  = jx * dx;
      ic = iyoff + ns * jx;
      /* Get interaction rates at one point (x,y). */
      WebRates(x, y, t, cdata + ic, fsave + ic, wdata);
      idxu = (jx == MX - 1) ? -ns : ns;
      idxl = (jx == 0) ? -ns : ns;
      for (i = 1; i <= ns; i++)
      {
        ici = ic + i - 1;
        /* Do differencing in y. */
        dcyli = cdata[ici] - cdata[ici - idyl];
        dcyui = cdata[ici + idyu] - cdata[ici];
        /* Do differencing in x. */
        dcxli = cdata[ici] - cdata[ici - idxl];
        dcxui = cdata[ici + idxu] - cdata[ici];
        /* Collect terms and load cdot elements. */
        cdotdata[ici] = coy[i - 1] * (dcyui - dcyli) +
                        cox[i - 1] * (dcxui - dcxli) + fsave[ici];
      }
    }
  }

  /* Quadrature equation (species 1) */
  cdotdata[NEQ] = doubleIntgr(c, ISPEC, wdata);

  return (0);
}